

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constpool.cpp
# Opt level: O0

void __thiscall asmjit::ConstPool::fill(ConstPool *this,void *dst)

{
  long *plVar1;
  long lVar2;
  void *in_RSI;
  long in_RDI;
  size_t i;
  ConstPoolFill filler;
  Node *left;
  size_t top;
  Node *stack [64];
  Node *node;
  ulong local_288;
  void *local_280;
  long local_278;
  void *local_270;
  undefined8 local_260;
  void *local_258;
  void **local_250;
  long local_248;
  long local_240 [66];
  long *local_30;
  void **local_28;
  long *local_20;
  long *local_18;
  void **local_10;
  long *local_8;
  
  local_270 = in_RSI;
  memset(in_RSI,0,*(size_t *)(in_RDI + 0xd0));
  local_250 = &local_280;
  local_258 = local_270;
  local_260 = 1;
  local_280 = local_270;
  local_278 = 1;
  local_288 = 0;
  while( true ) {
    if (5 < local_288) {
      return;
    }
    local_20 = (long *)(in_RDI + 8 + local_288 * 0x18);
    local_28 = &local_280;
    local_30 = (long *)*local_20;
    if (local_30 != (long *)0x0) break;
LAB_001f68c1:
    local_278 = local_278 << 1;
    local_288 = local_288 + 1;
  }
  local_240[0] = 0;
  do {
    while( true ) {
      local_248 = *local_30;
      if (local_248 == 0) break;
      if (local_240[0] == 0x40) {
        DebugUtils::assertionFailed((char *)stack[0x22],stack[0x21]._4_4_,(char *)stack[0x20]);
      }
      local_240[local_240[0] + 1] = (long)local_30;
      local_240[0] = local_240[0] + 1;
      local_30 = (long *)local_248;
    }
    while( true ) {
      local_10 = local_28;
      local_18 = local_30;
      if (-1 < (int)local_30[2]) {
        local_8 = local_30;
        memcpy((void *)((long)*local_28 + (ulong)*(uint *)((long)local_30 + 0x14)),local_30 + 3,
               (size_t)local_28[1]);
      }
      lVar2 = local_240[0];
      plVar1 = local_30 + 1;
      local_30 = (long *)*plVar1;
      if ((long *)*plVar1 != (long *)0x0) break;
      if (local_240[0] == 0) goto LAB_001f68c1;
      local_240[0] = local_240[0] + -1;
      local_30 = (long *)local_240[lVar2];
    }
  } while( true );
}

Assistant:

void ConstPool::fill(void* dst) const noexcept {
  // Clears possible gaps, asmjit should never emit garbage to the output.
  ::memset(dst, 0, _size);

  ConstPoolFill filler(static_cast<uint8_t*>(dst), 1);
  for (size_t i = 0; i < ASMJIT_ARRAY_SIZE(_tree); i++) {
    _tree[i].iterate(filler);
    filler._dataSize <<= 1;
  }
}